

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O3

REF_STATUS ref_part_plt_string(FILE *file,char *string,int maxlen)

{
  size_t sVar1;
  long lVar2;
  int letter;
  int local_24;
  
  lVar2 = 0;
  while( true ) {
    sVar1 = fread(&local_24,4,1,(FILE *)file);
    if (sVar1 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x8fe,
             "ref_part_plt_string","plt string letter",1,sVar1);
      return 1;
    }
    string[lVar2] = (char)local_24;
    if (local_24 == 0) break;
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x400) {
      return 1;
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_part_plt_string(FILE *file, char *string,
                                              int maxlen) {
  int i, letter;
  for (i = 0; i < maxlen; i++) {
    REIS(1, fread(&letter, sizeof(int), 1, file), "plt string letter");
    string[i] = (char)letter;
    if (0 == letter) {
      return REF_SUCCESS;
    }
  }
  return REF_FAILURE;
}